

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall
cs::type_t::type_t(type_t *this,function<cs_impl::any_()> *c,type_id *i,namespace_t *ext)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  
  std::function<cs_impl::any_()>::function(&this->constructor,c);
  (this->extensions).super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (ext->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (ext->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (ext->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->extensions).super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->extensions).super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (ext->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  sVar3 = i->type_hash;
  (this->id).type_idx._M_target = (i->type_idx)._M_target;
  (this->id).type_hash = sVar3;
  return;
}

Assistant:

type_t(std::function<var()> c, const type_id &i, namespace_t ext) : constructor(std::move(c)), id(i),
			extensions(std::move(ext)) {}